

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_util.c
# Opt level: O2

int test_kvtree_util_set_get_bytecount(void)

{
  int iVar1;
  int iVar2;
  kvtree *pkVar3;
  bool bVar4;
  kvtree *kvtree;
  unsigned_long roundtrip;
  
  roundtrip = 0;
  pkVar3 = (kvtree *)kvtree_new();
  kvtree = pkVar3;
  iVar1 = kvtree_util_set_bytecount(pkVar3,"KEY",0x11);
  iVar2 = kvtree_util_get_bytecount(pkVar3,"KEY",&roundtrip);
  bVar4 = roundtrip != 0x11;
  kvtree_delete(&kvtree);
  return (uint)((iVar2 != 0 || (iVar1 != 0 || pkVar3 == (kvtree *)0x0)) || bVar4);
}

Assistant:

int test_kvtree_util_set_get_bytecount(){
  int rc = TEST_PASS;
  char* key = "KEY";
  unsigned long value = 17;
  unsigned long roundtrip = 0;

  kvtree* kvtree = kvtree_new();

  if(kvtree == NULL) rc = TEST_FAIL;
  if(kvtree_util_set_bytecount(kvtree, key, value) != KVTREE_SUCCESS) rc = TEST_FAIL;
  if(kvtree_util_get_bytecount(kvtree, key, &roundtrip) != KVTREE_SUCCESS) rc = TEST_FAIL;
  if(roundtrip != value) rc = TEST_FAIL;

  kvtree_delete(&kvtree);
  return rc;
}